

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O2

bool __thiscall
cmCacheManager::LoadCache
          (cmCacheManager *this,string *path,bool internal,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *excludes,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *includes)

{
  _Rep_type *p_Var1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  iterator iVar6;
  mapped_type *this_00;
  ostream *poVar7;
  string *psVar8;
  string *psVar9;
  cmCacheManager *pcVar10;
  _Alloc_hider __s;
  allocator<char> local_4f1;
  string helpString;
  string local_4c8;
  string *local_4a8;
  cmCacheManager *local_4a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_498;
  CacheEntry e;
  string entryKey;
  string buffer;
  string cacheFile;
  ostringstream error;
  ifstream fin;
  byte abStack_218 [488];
  
  local_498 = &excludes->_M_t;
  std::__cxx11::string::string((string *)&cacheFile,(string *)path);
  std::__cxx11::string::append((char *)&cacheFile);
  if (internal) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
    ::clear(&(this->Cache)._M_t);
  }
  pcVar10 = (cmCacheManager *)&cacheFile;
  bVar2 = cmsys::SystemTools::FileExists((string *)pcVar10);
  if (bVar2) {
    std::ifstream::ifstream(&fin,cacheFile._M_dataplus._M_p,_S_in);
    bVar2 = (abStack_218[*(long *)(_fin + -0x18)] & 5) == 0;
    if (bVar2) {
      buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
      buffer._M_string_length = 0;
      buffer.field_2._M_local_buf[0] = '\0';
      entryKey._M_dataplus._M_p = (pointer)&entryKey.field_2;
      entryKey._M_string_length = 0;
      entryKey.field_2._M_local_buf[0] = '\0';
      p_Var1 = (_Rep_type *)&local_498->_M_impl;
      local_4a8 = path;
      local_4a0 = this;
      while (pcVar10 = local_4a0, (abStack_218[*(long *)(_fin + -0x18)] & 5) == 0) {
        helpString._M_dataplus._M_p = (pointer)&helpString.field_2;
        helpString._M_string_length = 0;
        e.Value._M_dataplus._M_p = (pointer)&e.Value.field_2;
        e.Value._M_string_length = 0;
        e.Value.field_2._M_local_buf[0] = '\0';
        e.Type = UNINITIALIZED;
        e.Properties.
        super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
        ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        e.Properties.
        super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
        ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        helpString.field_2._M_local_buf[0] = '\0';
        e.Properties.
        super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
        ._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &e.Properties.
              super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
              ._M_t._M_impl.super__Rb_tree_header._M_header;
        e.Properties.
        super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
        ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        e.Initialized = false;
        e.Properties.
        super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
        ._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             e.Properties.
             super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
             ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        cmsys::SystemTools::GetLineFromStream((istream *)&fin,&buffer,(bool *)0x0,-1);
        for (__s = buffer._M_dataplus; uVar5 = (ulong)(byte)*__s._M_p, uVar5 < 0x24;
            __s._M_p = __s._M_p + 1) {
          if ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0) {
            if ((0x800000001U >> (uVar5 & 0x3f) & 1) != 0) goto LAB_00259ee1;
            break;
          }
        }
        while (((char)uVar5 == '/' && (((byte *)__s._M_p)[1] == 0x2f))) {
          if ((((byte *)__s._M_p)[2] == 0x5c) && (((byte *)__s._M_p)[3] == 0x6e)) {
            std::__cxx11::string::append((char *)&helpString);
          }
          std::__cxx11::string::append((char *)&helpString);
          cmsys::SystemTools::GetLineFromStream((istream *)&fin,&buffer,(bool *)0x0,-1);
          uVar5 = (ulong)(byte)*buffer._M_dataplus._M_p;
          __s = buffer._M_dataplus;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&error,"HELPSTRING",(allocator<char> *)&local_4c8);
        CacheEntry::SetProperty(&e,(string *)&error,helpString._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&error);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&error,__s._M_p,(allocator<char> *)&local_4c8);
        bVar3 = cmState::ParseCacheEntry((string *)&error,&entryKey,&e.Value,&e.Type);
        std::__cxx11::string::~string((string *)&error);
        if (bVar3) {
          iVar6 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(local_498,&entryKey);
          if ((_Rb_tree_header *)iVar6._M_node == &(p_Var1->_M_impl).super__Rb_tree_header) {
            if ((!internal) && (e.Type == INTERNAL)) {
              iVar6 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(&includes->_M_t,&entryKey);
              if ((_Rb_tree_header *)iVar6._M_node ==
                  &(includes->_M_t)._M_impl.super__Rb_tree_header) goto LAB_00259ee1;
            }
            if (!internal) {
              e.Type = INTERNAL;
              std::__cxx11::string::assign((char *)&helpString);
              std::__cxx11::string::append((string *)&helpString);
              std::__cxx11::string::append((char *)&helpString);
              std::__cxx11::string::append((string *)&helpString);
              std::__cxx11::string::append((char *)&helpString);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&error,"HELPSTRING",(allocator<char> *)&local_4c8);
              CacheEntry::SetProperty(&e,(string *)&error,helpString._M_dataplus._M_p);
              std::__cxx11::string::~string((string *)&error);
            }
            bVar3 = ReadPropertyEntry(local_4a0,&entryKey,&e);
            if (!bVar3) {
              e.Initialized = true;
              this_00 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
                        ::operator[](&this->Cache,&entryKey);
              CacheEntry::operator=(this_00,&e);
            }
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
          poVar7 = std::operator<<((ostream *)&error,"Parse error in cache file ");
          std::operator<<(poVar7,(string *)&cacheFile);
          poVar7 = std::operator<<((ostream *)&error," on line ");
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          poVar7 = std::operator<<(poVar7,". Offending entry: ");
          std::operator<<(poVar7,__s._M_p);
          std::__cxx11::stringbuf::str();
          cmSystemTools::Error(&local_4c8);
          std::__cxx11::string::~string((string *)&local_4c8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
        }
LAB_00259ee1:
        CacheEntry::~CacheEntry(&e);
        std::__cxx11::string::~string((string *)&helpString);
      }
      local_4a0->CacheMajorVersion = 0;
      local_4a0->CacheMinorVersion = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&error,"CMAKE_CACHE_MAJOR_VERSION",(allocator<char> *)&e);
      psVar8 = GetInitializedCacheValue(pcVar10,(string *)&error);
      psVar9 = local_4a8;
      std::__cxx11::string::~string((string *)&error);
      if (psVar8 == (string *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&error,"CMAKE_CACHE_MINOR_VERSION",(allocator<char> *)&e);
        AddCacheEntry(pcVar10,(string *)&error,"0",
                      "Minor version of cmake used to create the current loaded cache",INTERNAL);
        std::__cxx11::string::~string((string *)&error);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&error,"CMAKE_CACHE_MAJOR_VERSION",(allocator<char> *)&e);
        AddCacheEntry(pcVar10,(string *)&error,"0",
                      "Major version of cmake used to create the current loaded cache",INTERNAL);
        std::__cxx11::string::~string((string *)&error);
      }
      else {
        e.Value._M_dataplus._M_p = e.Value._M_dataplus._M_p & 0xffffffff00000000;
        iVar4 = __isoc99_sscanf((psVar8->_M_dataplus)._M_p,"%u");
        if (iVar4 == 1) {
          pcVar10->CacheMajorVersion = (uint)e.Value._M_dataplus._M_p;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&error,"CMAKE_CACHE_MINOR_VERSION",(allocator<char> *)&helpString);
        psVar8 = GetInitializedCacheValue(pcVar10,(string *)&error);
        std::__cxx11::string::~string((string *)&error);
        if (psVar8 != (string *)0x0) {
          iVar4 = __isoc99_sscanf((psVar8->_M_dataplus)._M_p,"%u",&e);
          if (iVar4 == 1) {
            pcVar10->CacheMinorVersion = (uint)e.Value._M_dataplus._M_p;
          }
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&error,"CMAKE_CACHEFILE_DIR",(allocator<char> *)&e);
      psVar8 = GetInitializedCacheValue(pcVar10,(string *)&error);
      std::__cxx11::string::~string((string *)&error);
      if (internal && psVar8 != (string *)0x0) {
        std::__cxx11::string::string((string *)&e,(string *)psVar9);
        std::__cxx11::string::string((string *)&helpString,(string *)psVar8);
        cmsys::SystemTools::ConvertToUnixSlashes(&e.Value);
        std::__cxx11::string::append((char *)&e);
        std::__cxx11::string::append((char *)&helpString);
        bVar3 = cmsys::SystemTools::SameFile(&helpString,&e.Value);
        if (!bVar3) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&error,"CMAKE_CACHEFILE_DIR",(allocator<char> *)&local_4c8);
          psVar9 = GetInitializedCacheValue(pcVar10,(string *)&error);
          std::__cxx11::string::~string((string *)&error);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
          poVar7 = std::operator<<((ostream *)&error,"The current CMakeCache.txt directory ");
          poVar7 = std::operator<<(poVar7,(string *)&e);
          poVar7 = std::operator<<(poVar7," is different than the directory ");
          if (psVar9 == (string *)0x0) {
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c8,"",&local_4f1);
          }
          else {
            std::__cxx11::string::string((string *)&local_4c8,(string *)psVar9);
          }
          poVar7 = std::operator<<(poVar7,(string *)&local_4c8);
          std::operator<<(poVar7,
                          " where CMakeCache.txt was created. This may result in binaries being created in the wrong place. If you are not sure, reedit the CMakeCache.txt"
                         );
          std::__cxx11::string::~string((string *)&local_4c8);
          std::__cxx11::stringbuf::str();
          cmSystemTools::Error(&local_4c8);
          std::__cxx11::string::~string((string *)&local_4c8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
        }
        std::__cxx11::string::~string((string *)&helpString);
        std::__cxx11::string::~string((string *)&e);
      }
      std::__cxx11::string::~string((string *)&entryKey);
      std::__cxx11::string::~string((string *)&buffer);
    }
    std::ifstream::~ifstream(&fin);
  }
  else {
    CleanCMakeFiles(pcVar10,path);
    bVar2 = false;
  }
  std::__cxx11::string::~string((string *)&cacheFile);
  return bVar2;
}

Assistant:

bool cmCacheManager::LoadCache(const std::string& path, bool internal,
                               std::set<std::string>& excludes,
                               std::set<std::string>& includes)
{
  std::string cacheFile = path;
  cacheFile += "/CMakeCache.txt";
  // clear the old cache, if we are reading in internal values
  if (internal) {
    this->Cache.clear();
  }
  if (!cmSystemTools::FileExists(cacheFile)) {
    this->CleanCMakeFiles(path);
    return false;
  }

  cmsys::ifstream fin(cacheFile.c_str());
  if (!fin) {
    return false;
  }
  const char* realbuffer;
  std::string buffer;
  std::string entryKey;
  unsigned int lineno = 0;
  while (fin) {
    // Format is key:type=value
    std::string helpString;
    CacheEntry e;
    cmSystemTools::GetLineFromStream(fin, buffer);
    lineno++;
    realbuffer = buffer.c_str();
    while (*realbuffer != '0' &&
           (*realbuffer == ' ' || *realbuffer == '\t' || *realbuffer == '\r' ||
            *realbuffer == '\n')) {
      if (*realbuffer == '\n') {
        lineno++;
      }
      realbuffer++;
    }
    // skip blank lines and comment lines
    if (realbuffer[0] == '#' || realbuffer[0] == 0) {
      continue;
    }
    while (realbuffer[0] == '/' && realbuffer[1] == '/') {
      if ((realbuffer[2] == '\\') && (realbuffer[3] == 'n')) {
        helpString += "\n";
        helpString += &realbuffer[4];
      } else {
        helpString += &realbuffer[2];
      }
      cmSystemTools::GetLineFromStream(fin, buffer);
      lineno++;
      realbuffer = buffer.c_str();
      if (!fin) {
        continue;
      }
    }
    e.SetProperty("HELPSTRING", helpString.c_str());
    if (cmState::ParseCacheEntry(realbuffer, entryKey, e.Value, e.Type)) {
      if (excludes.find(entryKey) == excludes.end()) {
        // Load internal values if internal is set.
        // If the entry is not internal to the cache being loaded
        // or if it is in the list of internal entries to be
        // imported, load it.
        if (internal || (e.Type != cmStateEnums::INTERNAL) ||
            (includes.find(entryKey) != includes.end())) {
          // If we are loading the cache from another project,
          // make all loaded entries internal so that it is
          // not visible in the gui
          if (!internal) {
            e.Type = cmStateEnums::INTERNAL;
            helpString = "DO NOT EDIT, ";
            helpString += entryKey;
            helpString += " loaded from external file.  "
                          "To change this value edit this file: ";
            helpString += path;
            helpString += "/CMakeCache.txt";
            e.SetProperty("HELPSTRING", helpString.c_str());
          }
          if (!this->ReadPropertyEntry(entryKey, e)) {
            e.Initialized = true;
            this->Cache[entryKey] = e;
          }
        }
      }
    } else {
      std::ostringstream error;
      error << "Parse error in cache file " << cacheFile;
      error << " on line " << lineno << ". Offending entry: " << realbuffer;
      cmSystemTools::Error(error.str());
    }
  }
  this->CacheMajorVersion = 0;
  this->CacheMinorVersion = 0;
  if (const std::string* cmajor =
        this->GetInitializedCacheValue("CMAKE_CACHE_MAJOR_VERSION")) {
    unsigned int v = 0;
    if (sscanf(cmajor->c_str(), "%u", &v) == 1) {
      this->CacheMajorVersion = v;
    }
    if (const std::string* cminor =
          this->GetInitializedCacheValue("CMAKE_CACHE_MINOR_VERSION")) {
      if (sscanf(cminor->c_str(), "%u", &v) == 1) {
        this->CacheMinorVersion = v;
      }
    }
  } else {
    // CMake version not found in the list file.
    // Set as version 0.0
    this->AddCacheEntry("CMAKE_CACHE_MINOR_VERSION", "0",
                        "Minor version of cmake used to create the "
                        "current loaded cache",
                        cmStateEnums::INTERNAL);
    this->AddCacheEntry("CMAKE_CACHE_MAJOR_VERSION", "0",
                        "Major version of cmake used to create the "
                        "current loaded cache",
                        cmStateEnums::INTERNAL);
  }
  // check to make sure the cache directory has not
  // been moved
  const std::string* oldDir =
    this->GetInitializedCacheValue("CMAKE_CACHEFILE_DIR");
  if (internal && oldDir) {
    std::string currentcwd = path;
    std::string oldcwd = *oldDir;
    cmSystemTools::ConvertToUnixSlashes(currentcwd);
    currentcwd += "/CMakeCache.txt";
    oldcwd += "/CMakeCache.txt";
    if (!cmSystemTools::SameFile(oldcwd, currentcwd)) {
      const std::string* dir =
        this->GetInitializedCacheValue("CMAKE_CACHEFILE_DIR");
      std::ostringstream message;
      message << "The current CMakeCache.txt directory " << currentcwd
              << " is different than the directory " << (dir ? *dir : "")
              << " where CMakeCache.txt was created. This may result "
                 "in binaries being created in the wrong place. If you "
                 "are not sure, reedit the CMakeCache.txt";
      cmSystemTools::Error(message.str());
    }
  }
  return true;
}